

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampler_init_preallocated
                    (ma_resampler_config *pConfig,void *pHeap,ma_resampler *pResampler)

{
  ma_resampler *in_RDX;
  void *in_RSI;
  ma_resampler_config *in_RDI;
  ma_result result;
  ma_result local_14;
  
  if (in_RDX == (ma_resampler *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (ma_resampler *)0x0) {
      memset(in_RDX,0,0xc0);
    }
    if (in_RDI == (ma_resampler_config *)0x0) {
      local_14 = MA_INVALID_ARGS;
    }
    else {
      in_RDX->_pHeap = in_RSI;
      in_RDX->format = in_RDI->format;
      in_RDX->channels = in_RDI->channels;
      in_RDX->sampleRateIn = in_RDI->sampleRateIn;
      in_RDX->sampleRateOut = in_RDI->sampleRateOut;
      local_14 = ma_resampler_get_vtable
                           (in_RDI,in_RDX,&in_RDX->pBackendVTable,&in_RDX->pBackendUserData);
      if (local_14 == MA_SUCCESS) {
        if ((in_RDX->pBackendVTable == (ma_resampling_backend_vtable *)0x0) ||
           (in_RDX->pBackendVTable->onInit ==
            (_func_ma_result_void_ptr_ma_resampler_config_ptr_void_ptr_ma_resampling_backend_ptr_ptr
             *)0x0)) {
          local_14 = MA_NOT_IMPLEMENTED;
        }
        else {
          local_14 = (*in_RDX->pBackendVTable->onInit)
                               (in_RDX->pBackendUserData,in_RDI,in_RSI,&in_RDX->pBackend);
          if (local_14 == MA_SUCCESS) {
            local_14 = MA_SUCCESS;
          }
        }
      }
    }
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_resampler_init_preallocated(const ma_resampler_config* pConfig, void* pHeap, ma_resampler* pResampler)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    pResampler->_pHeap        = pHeap;
    pResampler->format        = pConfig->format;
    pResampler->channels      = pConfig->channels;
    pResampler->sampleRateIn  = pConfig->sampleRateIn;
    pResampler->sampleRateOut = pConfig->sampleRateOut;

    result = ma_resampler_get_vtable(pConfig, pResampler, &pResampler->pBackendVTable, &pResampler->pBackendUserData);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onInit == NULL) {
        return MA_NOT_IMPLEMENTED;  /* onInit not implemented. */
    }

    result = pResampler->pBackendVTable->onInit(pResampler->pBackendUserData, pConfig, pHeap, &pResampler->pBackend);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}